

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextGLImpl::NextSubpass(DeviceContextGLImpl *this)

{
  pointer pOVar1;
  
  EndSubpass(this);
  DeviceContextBase<Diligent::EngineGLImplTraits>::NextSubpass
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>);
  BeginSubpass(this);
  pOVar1 = (this->m_AttachmentClearValues).
           super__Vector_base<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_AttachmentClearValues).
      super__Vector_base<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
      ._M_impl.super__Vector_impl_data._M_finish != pOVar1) {
    (this->m_AttachmentClearValues).
    super__Vector_base<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
    ._M_impl.super__Vector_impl_data._M_finish = pOVar1;
  }
  return;
}

Assistant:

void DeviceContextGLImpl::NextSubpass()
{
    EndSubpass();
    TDeviceContextBase::NextSubpass();
    BeginSubpass();
    m_AttachmentClearValues.clear();
}